

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_struct_result_writer
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  members_type *this_00;
  size_type sVar6;
  reference pptVar7;
  string *psVar8;
  t_type *ptVar9;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  allocator local_411;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  byte local_2c9;
  undefined1 local_2c8 [7];
  bool null_allowed;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_208
  ;
  t_field **local_200;
  byte local_1f1;
  undefined1 local_1f0 [7];
  bool first;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  allocator local_141;
  string local_140;
  undefined1 local_120 [8];
  string tmpvar;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_40);
  poVar5 = std::operator<<(poVar5,
                           "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,")");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_70);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar5 = std::operator<<(poVar5,"oprot.IncrementRecursionDepth();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"try");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)((long)&name.field_2 + 8),(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)(name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_up((t_generator *)this);
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar3));
  this_00 = t_struct::get_sorted_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&tmpvar.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"tmp",&local_141);
  t_generator::tmp((string *)local_120,(t_generator *)this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_168);
  poVar5 = std::operator<<(poVar5,"var ");
  poVar5 = std::operator<<(poVar5,(string *)local_120);
  poVar5 = std::operator<<(poVar5," = new TStruct(\"");
  poVar5 = std::operator<<(poVar5,(string *)&fields);
  poVar5 = std::operator<<(poVar5,"\");");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_188);
  poVar5 = std::operator<<(poVar5,"await oprot.WriteStructBeginAsync(");
  poVar5 = std::operator<<(poVar5,(string *)local_120);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar6 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"tmp",&local_1c9);
    t_generator::tmp(&local_1a8,(t_generator *)this,&local_1c8);
    std::__cxx11::string::operator=((string *)local_120,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_((string *)local_1f0,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)local_1f0);
    poVar5 = std::operator<<(poVar5,"var ");
    poVar5 = std::operator<<(poVar5,(string *)local_120);
    poVar5 = std::operator<<(poVar5," = new TField();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_1f0);
    local_1f1 = 1;
    local_200 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    tmpvar.field_2._8_8_ = local_200;
    while( true ) {
      local_208._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&tmpvar.field_2 + 8),&local_208);
      ptVar1 = tstruct_local;
      if (!bVar2) break;
      if ((local_1f1 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_248);
        std::operator<<(poVar5,"else if");
        std::__cxx11::string::~string((string *)&local_248);
      }
      else {
        local_1f1 = 0;
        poVar5 = std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_228);
        std::operator<<(poVar5,"if");
        std::__cxx11::string::~string((string *)&local_228);
      }
      poVar5 = std::operator<<((ostream *)tstruct_local,"(this.__isset.");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
      std::__cxx11::string::string((string *)&local_2a8,(string *)psVar8);
      normalize_name(&local_288,this,&local_2a8,false);
      get_isset_name(&local_268,this,&local_288);
      poVar5 = std::operator<<(poVar5,(string *)&local_268);
      poVar5 = std::operator<<(poVar5,")");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_2c8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)local_2c8);
      poVar5 = std::operator<<(poVar5,"{");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_2c8);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      t_generator::indent_up((t_generator *)this);
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      ptVar9 = t_field::get_type(*pptVar7);
      local_2c9 = type_can_be_null(ptVar9);
      ptVar1 = tstruct_local;
      if ((bool)local_2c9) {
        t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2f0);
        poVar5 = std::operator<<(poVar5,"if (");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)((long)&tmpvar.field_2 + 8));
        prop_name_abi_cxx11_(&local_310,this,*pptVar7,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_310);
        poVar5 = std::operator<<(poVar5," != null)");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_330);
        poVar5 = std::operator<<(poVar5,"{");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_2f0);
        t_generator::indent_up((t_generator *)this);
      }
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_350);
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,".Name = \"");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      prop_name_abi_cxx11_(&local_370,this,*pptVar7,false);
      poVar5 = std::operator<<(poVar5,(string *)&local_370);
      poVar5 = std::operator<<(poVar5,"\";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_390);
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,".Type = ");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      ptVar9 = t_field::get_type(*pptVar7);
      type_to_enum_abi_cxx11_(&local_3b0,this,ptVar9);
      poVar5 = std::operator<<(poVar5,(string *)&local_3b0);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_3d0);
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,".ID = ");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      iVar4 = t_field::get_key(*pptVar7);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_3f0);
      poVar5 = std::operator<<(poVar5,"await oprot.WriteFieldBeginAsync(");
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      ptVar1 = tstruct_local;
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tmpvar.field_2 + 8));
      tfield = *pptVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_410,"",&local_411);
      generate_serialize_field(this,(ostream *)ptVar1,tfield,&local_410,false);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_438,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_438);
      poVar5 = std::operator<<(poVar5,"await oprot.WriteFieldEndAsync(");
      poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_438);
      if ((local_2c9 & 1) != 0) {
        t_generator::indent_down((t_generator *)this);
        ptVar1 = tstruct_local;
        t_generator::indent_abi_cxx11_(&local_458,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_458);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_458);
      }
      t_generator::indent_down((t_generator *)this);
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_478,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_478);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_478);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&tmpvar.field_2 + 8));
    }
  }
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_498,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_498);
  poVar5 = std::operator<<(poVar5,"await oprot.WriteFieldStopAsync(");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_4b8);
  poVar5 = std::operator<<(poVar5,"await oprot.WriteStructEndAsync(");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_4d8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_4d8);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_4f8);
  poVar5 = std::operator<<(poVar5,"finally");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_518);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_538);
  poVar5 = std::operator<<(poVar5,"oprot.DecrementRecursionDepth();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_538);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_558);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_558);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_578,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_578);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_result_writer(ostream& out, t_struct* tstruct)
{
    out << indent() << "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    string name = tstruct->get_name();
    const vector<t_field*>& fields = tstruct->get_sorted_members();
    vector<t_field*>::const_iterator f_iter;

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = new TStruct(\"" << name << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

    if (fields.size() > 0)
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TField();" << endl;
        bool first = true;
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            if (first)
            {
                first = false;
                out << endl << indent() << "if";
            }
            else
            {
                out << indent() << "else if";
            }

            out << "(this.__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << ")" << endl
                << indent() << "{" << endl;
            indent_up();

            bool null_allowed = type_can_be_null((*f_iter)->get_type());
            if (null_allowed)
            {
                out << indent() << "if (" << prop_name(*f_iter) << " != null)" << endl
                    << indent() << "{" << endl;
                indent_up();
            }

            out << indent() << tmpvar << ".Name = \"" << prop_name(*f_iter) << "\";" << endl
                << indent() << tmpvar << ".Type = " << type_to_enum((*f_iter)->get_type()) << ";" << endl
                << indent() << tmpvar << ".ID = " << (*f_iter)->get_key() << ";" << endl
                << indent() << "await oprot.WriteFieldBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

            generate_serialize_field(out, *f_iter);

            out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

            if (null_allowed)
            {
                indent_down();
                out << indent() << "}" << endl;
            }

            indent_down();
            out << indent() << "}" << endl;
        }
    }

    out << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}